

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this,
          shared_ptr<nuraft::buffer> *result,cmd_result_code code)

{
  (this->empty_result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->empty_result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
             &result->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
  (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->code_ = code;
  this->has_result_ = true;
  this->accepted_ = false;
  *(undefined8 *)&(this->handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->handler_).super__Function_base._M_functor + 8) = 0;
  (this->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->handler_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->handler2_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->handler2_).super__Function_base._M_functor + 8) = 0;
  (this->handler2_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->handler2_)._M_invoker = (_Invoker_type)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cv_);
  return;
}

Assistant:

explicit cmd_result(T& result,
                        cmd_result_code code = cmd_result_code::OK)
        : result_(result)
        , err_()
        , code_(code)
        , has_result_(true)
        , accepted_(false)
        , handler_(nullptr)
        , handler2_(nullptr)
        {}